

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netmin.cpp
# Opt level: O3

void __thiscall NetworkNS::NetwMin::NetwMin(NetwMin *this,string *filename)

{
  pointer pcVar1;
  Domain *pDVar2;
  Network *this_00;
  RanMars *this_01;
  dump *this_02;
  Grid *this_03;
  string local_80;
  string local_60;
  string local_40;
  
  pDVar2 = (Domain *)operator_new(0xa0);
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + filename->_M_string_length);
  Domain::Domain(pDVar2,&local_40);
  this->domain = pDVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#: Domain characteristics have been read.\n",0x2a);
  this_00 = (Network *)operator_new(0xb0);
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + filename->_M_string_length);
  Network::Network(this_00,this,&local_60);
  this->network = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#: Network has been read.\n",0x1a);
  this_01 = (RanMars *)operator_new(0x30);
  RanMars::RanMars(this_01,0x2b67);
  this->my_rnd_gen = this_01;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#: Particles have been read.\n",0x1d);
  this_02 = (dump *)operator_new(0x208);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"dump_b3D.lammpstrj","");
  dump::dump(this_02,&local_80);
  this->my_traj_file = this_02;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#: \'dump_b3D.lammpstrj\' will be used as trajectory file.\n",
             0x39);
  this_03 = (Grid *)operator_new(0x60);
  pDVar2 = this->domain;
  Grid::Grid(this_03,pDVar2->XBoxLen,pDVar2->YBoxLen,pDVar2->ZBoxLen,5,5,5);
  this->grid = this_03;
  write_network_to_lammps_data_file(this);
  return;
}

Assistant:

NetwMin::NetwMin(std::string filename){
      
      domain = new Domain(filename);
      cout << "#: Domain characteristics have been read.\n";
      network = new Network(this,filename);
      cout << "#: Network has been read.\n";
      my_rnd_gen = new RanMars(11111);
      
      cout << "#: Particles have been read.\n";
      
      my_traj_file = new dump("dump_b3D.lammpstrj");
      cout << "#: 'dump_b3D.lammpstrj' will be used as trajectory file.\n";
   
      grid = new Grid(domain->XBoxLen, domain->YBoxLen, domain->ZBoxLen, 5, 5, 5);
      write_network_to_lammps_data_file();
      
      return;
   }